

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcmp_s.c
# Opt level: O3

errno_t strcmp_s(char *dest,rsize_t dmax,char *src,int *indicator)

{
  long lVar1;
  char cVar2;
  int iVar3;
  errno_t error;
  errno_t eVar4;
  char *msg;
  rsize_t rVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (indicator == (int *)0x0) {
    msg = "strcmp_s: indicator is null";
LAB_00104c10:
    eVar4 = 400;
    error = 400;
  }
  else {
    *indicator = 0;
    if (dest == (char *)0x0) {
      msg = "strcmp_s: dest is null";
      goto LAB_00104c10;
    }
    if (src == (char *)0x0) {
      msg = "strcmp_s: src is null";
      goto LAB_00104c10;
    }
    if (dmax == 0) {
      msg = "strcmp_s: dmax is 0";
      eVar4 = 0x191;
      error = 0x191;
    }
    else {
      if (dmax < 0x10000001) {
        cVar2 = *dest;
        eVar4 = 0;
        if (cVar2 == '\0') {
          iVar3 = 0;
        }
        else {
          rVar5 = 0;
          do {
            if (((cVar2 != src[rVar5]) || (src[rVar5] == '\0')) || (dmax == rVar5))
            goto LAB_00104c86;
            cVar2 = dest[rVar5 + 1];
            rVar5 = rVar5 + 1;
          } while (cVar2 != '\0');
          cVar2 = '\0';
LAB_00104c86:
          src = src + rVar5;
          iVar3 = (int)cVar2;
        }
        *indicator = iVar3 - *src;
        goto LAB_00104c21;
      }
      msg = "strcmp_s: dmax exceeds max";
      eVar4 = 0x193;
      error = 0x193;
    }
  }
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_00104c21:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return eVar4;
}

Assistant:

errno_t
strcmp_s (const char *dest, rsize_t dmax,
          const char *src, int *indicator)
{
    if (indicator == NULL) {
        invoke_safe_str_constraint_handler("strcmp_s: indicator is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }
    *indicator = 0;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcmp_s: dest is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strcmp_s: src is null",
                   NULL, ESNULLP);
        return RCNEGATE(ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcmp_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcmp_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(ESLEMAX);
    }

    while (*dest && *src && dmax) {

        if (*dest != *src) {
            break;
        }

        dest++;
        src++;
        dmax--;
    }

    *indicator = *dest - *src;
    return RCNEGATE(EOK);
}